

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf.c
# Opt level: O3

void alf_one_blk_chroma(pel *dst,int i_dst,pel *src,int i_src,int lcu_width,int lcu_height,int *coef
                       ,int sample_bit_depth)

{
  pel *ppVar1;
  pel *ppVar2;
  pel *ppVar3;
  pel *ppVar4;
  long lVar5;
  pel *ppVar6;
  uint uVar7;
  pel *ppVar8;
  uint uVar9;
  uint uVar10;
  pel pVar11;
  uint uVar12;
  pel *ppVar13;
  pel *ppVar14;
  uint uVar15;
  pel *ppVar16;
  pel *local_b0;
  
  if (0 < lcu_height) {
    uVar7 = ~(-1 << ((byte)sample_bit_depth & 0x1f));
    uVar9 = 0;
    do {
      ppVar1 = src + i_src;
      ppVar2 = src + -(long)i_src;
      ppVar3 = src + i_src * 2;
      ppVar4 = src + -(long)(i_src * 2);
      ppVar14 = src + i_src * 3;
      ppVar6 = ppVar1;
      ppVar8 = ppVar2;
      ppVar13 = ppVar3;
      ppVar16 = ppVar4;
      if (uVar9 < 3) {
        ppVar8 = src;
        ppVar16 = src;
        local_b0 = src;
        if ((uVar9 != 0) && (ppVar8 = ppVar2, ppVar16 = ppVar4, local_b0 = ppVar4, uVar9 == 1)) {
          ppVar16 = ppVar2;
          local_b0 = ppVar2;
        }
      }
      else {
        local_b0 = src + -(long)(i_src * 3);
        if (((lcu_height + -4 < (int)uVar9) &&
            (ppVar6 = src, ppVar13 = src, ppVar14 = src, uVar9 != lcu_height - 1U)) &&
           (ppVar6 = ppVar1, ppVar13 = ppVar3, ppVar14 = ppVar3, uVar9 == lcu_height - 2U)) {
          ppVar13 = ppVar1;
          ppVar14 = ppVar1;
        }
      }
      if (0 < lcu_width * 2) {
        lVar5 = 0;
        do {
          uVar10 = (int)((uint)src[lVar5] * coef[0x10] +
                         ((uint)src[lVar5 + -6] + (uint)src[lVar5 + 6]) * coef[10] +
                         ((uint)src[lVar5 + -4] + (uint)src[lVar5 + 4]) * coef[0xc] +
                         ((uint)src[lVar5 + -2] + (uint)src[lVar5 + 2]) * coef[0xe] +
                         ((uint)ppVar8[lVar5 + 2] + (uint)ppVar6[lVar5 + -2]) * coef[8] +
                         ((uint)ppVar8[lVar5] + (uint)ppVar6[lVar5]) * coef[6] +
                         ((uint)ppVar8[lVar5 + -2] + (uint)ppVar6[lVar5 + 2]) * coef[4] +
                         ((uint)ppVar16[lVar5] + (uint)ppVar13[lVar5]) * coef[2] +
                         ((uint)local_b0[lVar5] + (uint)ppVar14[lVar5]) * *coef + 0x20) >> 6;
          uVar12 = uVar10;
          if ((int)uVar7 <= (int)uVar10) {
            uVar12 = uVar7;
          }
          uVar15 = (int)((uint)src[lVar5 + 1] * coef[0x11] +
                         ((uint)src[lVar5 + -5] + (uint)src[lVar5 + 7]) * coef[0xb] +
                         ((uint)src[lVar5 + -3] + (uint)src[lVar5 + 5]) * coef[0xd] +
                         ((uint)src[lVar5 + -1] + (uint)src[lVar5 + 3]) * coef[0xf] +
                         ((uint)ppVar8[lVar5 + 3] + (uint)ppVar6[lVar5 + -1]) * coef[9] +
                         ((uint)ppVar8[lVar5 + 1] + (uint)ppVar6[lVar5 + 1]) * coef[7] +
                         ((uint)ppVar8[lVar5 + -1] + (uint)ppVar6[lVar5 + 3]) * coef[5] +
                         ((uint)ppVar16[lVar5 + 1] + (uint)ppVar13[lVar5 + 1]) * coef[3] +
                         ((uint)local_b0[lVar5 + 1] + (uint)ppVar14[lVar5 + 1]) * coef[1] + 0x20) >>
                   6;
          pVar11 = (pel)uVar12;
          if ((int)uVar10 < 0) {
            pVar11 = '\0';
          }
          dst[lVar5] = pVar11;
          uVar12 = uVar15;
          if ((int)uVar7 <= (int)uVar15) {
            uVar12 = uVar7;
          }
          pVar11 = (pel)uVar12;
          if ((int)uVar15 < 0) {
            pVar11 = '\0';
          }
          dst[lVar5 + 1] = pVar11;
          lVar5 = lVar5 + 2;
        } while (lVar5 < lcu_width * 2);
      }
      dst = dst + i_dst;
      uVar9 = uVar9 + 1;
      src = ppVar1;
    } while (uVar9 != lcu_height);
  }
  return;
}

Assistant:

static void alf_one_blk_chroma(pel *dst, int i_dst, pel *src, int i_src, int lcu_width, int lcu_height, int *coef, int sample_bit_depth)
{
    pel *p1, *p2, *p3, *p4, *p5, *p6;

    int i, j;
    int startPos = 0;
    int endPos = lcu_height;
    int max_pel = (1 << sample_bit_depth) - 1;

    for (i = startPos; i < endPos; i++)
    {
        p1 = src + i_src;
        p2 = src - i_src;
        p3 = src + 2 * i_src;
        p4 = src - 2 * i_src;
        p5 = src + 3 * i_src;
        p6 = src - 3 * i_src;
        if (i < 3) {
            if (i == 0) {
                p4 = p2 = src;
            }
            else if (i == 1) {
                p4 = p2;
            }
            p6 = p4;
        }
        else if (i > lcu_height - 4) {
            if (i == lcu_height - 1) {
                p3 = p1 = src;
            }
            else if (i == lcu_height - 2) {
                p3 = p1;
            }
            p5 = p3;
        }

        for (j = 0; j < lcu_width << 1; j += 2)
        {
            int pixelIntU, pixelIntV;
            int xLeft = j - 2;
            int xRight = j + 2;

            pixelIntU  = coef[0 ] * (p5[j         ] + p6[j]);
            pixelIntV  = coef[1 ] * (p5[j + 1     ] + p6[j + 1]);
            pixelIntU += coef[2 ] * (p3[j         ] + p4[j]);
            pixelIntV += coef[3 ] * (p3[j + 1     ] + p4[j + 1]);
            pixelIntU += coef[4 ] * (p1[xRight    ] + p2[xLeft]);
            pixelIntV += coef[5 ] * (p1[xRight + 1] + p2[xLeft + 1]);
            pixelIntU += coef[6 ] * (p1[j         ] + p2[j]);
            pixelIntV += coef[7 ] * (p1[j + 1     ] + p2[j + 1]);
            pixelIntU += coef[8 ] * (p1[xLeft     ] + p2[xRight]);
            pixelIntV += coef[9 ] * (p1[xLeft + 1 ] + p2[xRight + 1]);
            pixelIntU += coef[14] * (src [xRight    ] + src [xLeft]);
            pixelIntV += coef[15] * (src [xRight + 1] + src [xLeft + 1]);

            xLeft  = j - 4;
            xRight = j + 4;
            pixelIntU += coef[12] * (src [xRight    ] + src [xLeft]);
            pixelIntV += coef[13] * (src [xRight + 1] + src [xLeft + 1]);

            xLeft  = j - 6;
            xRight = j + 6;
            pixelIntU += coef[10] * (src [xRight    ] + src [xLeft]);
            pixelIntV += coef[11] * (src [xRight + 1] + src [xLeft + 1]);

            pixelIntU += coef[16] * (src[j]);
            pixelIntV += coef[17] * (src[j + 1]);

            pixelIntU = (int)((pixelIntU + 32) >> 6);
            pixelIntV = (int)((pixelIntV + 32) >> 6);

            dst[j    ] = COM_CLIP3(0, max_pel, pixelIntU);
            dst[j + 1] = COM_CLIP3(0, max_pel, pixelIntV);

        }
        src += i_src;
        dst += i_dst;
    }
}